

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O3

int mbedtls_ecjpake_read_round_two(mbedtls_ecjpake_context *ctx,uchar *buf,size_t len)

{
  mbedtls_ecp_group *grp_00;
  int iVar1;
  mbedtls_ecjpake_role mVar2;
  undefined1 local_128 [8];
  mbedtls_ecp_group grp;
  mbedtls_ecp_point G;
  uchar *p;
  
  G.Z._8_8_ = buf;
  mbedtls_ecp_group_init((mbedtls_ecp_group *)local_128);
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&grp.T_size);
  grp_00 = &ctx->grp;
  iVar1 = ecjpake_ecp_add3(grp_00,(mbedtls_ecp_point *)&grp.T_size,&ctx->Xm1,&ctx->Xm2,&ctx->Xp1);
  if (iVar1 == 0) {
    mVar2 = ctx->role;
    if (mVar2 == MBEDTLS_ECJPAKE_CLIENT) {
      iVar1 = mbedtls_ecp_tls_read_group((mbedtls_ecp_group *)local_128,(uchar **)&G.Z.s,len);
      if ((iVar1 != 0) || (iVar1 = -0x4e80, local_128._0_4_ != grp_00->id)) goto LAB_001b86c5;
      mVar2 = ctx->role;
    }
    iVar1 = ecjpake_kkp_read(ctx->md_type,grp_00,ctx->point_format,(mbedtls_ecp_point *)&grp.T_size,
                             &ctx->Xp,ecjpake_id[1 - mVar2],(uchar **)&G.Z.s,buf + len);
    if (iVar1 == 0) {
      iVar1 = -0x4f80;
      if ((uchar *)G.Z._8_8_ == buf + len) {
        iVar1 = 0;
      }
    }
  }
LAB_001b86c5:
  mbedtls_ecp_group_free((mbedtls_ecp_group *)local_128);
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&grp.T_size);
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_read_round_two(mbedtls_ecjpake_context *ctx,
                                   const unsigned char *buf,
                                   size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = buf;
    const unsigned char *end = buf + len;
    mbedtls_ecp_group grp;
    mbedtls_ecp_point G;    /* C: GB, S: GA */

    mbedtls_ecp_group_init(&grp);
    mbedtls_ecp_point_init(&G);

    /*
     * Server: GA = X3  + X4  + X1      (7.4.2.6.1)
     * Client: GB = X1  + X2  + X3      (7.4.2.5.1)
     * Unified: G = Xm1 + Xm2 + Xp1
     * We need that before parsing in order to check Xp as we read it
     */
    MBEDTLS_MPI_CHK(ecjpake_ecp_add3(&ctx->grp, &G,
                                     &ctx->Xm1, &ctx->Xm2, &ctx->Xp1));

    /*
     * struct {
     *     ECParameters curve_params;   // only client reading server msg
     *     ECJPAKEKeyKP ecjpake_key_kp;
     * } Client/ServerECJPAKEParams;
     */
    if (ctx->role == MBEDTLS_ECJPAKE_CLIENT) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_tls_read_group(&grp, &p, len));
        if (grp.id != ctx->grp.id) {
            ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
            goto cleanup;
        }
    }

    MBEDTLS_MPI_CHK(ecjpake_kkp_read(ctx->md_type, &ctx->grp,
                                     ctx->point_format,
                                     &G, &ctx->Xp, ID_PEER, &p, end));

    if (p != end) {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_group_free(&grp);
    mbedtls_ecp_point_free(&G);

    return ret;
}